

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O0

void processChunkShared(Image *output,uint32_t size,Type type,int width,int height,istream *file,
                       string *name,bool isSwitch)

{
  undefined1 uVar1;
  int iVar2;
  Size SVar3;
  runtime_error *prVar4;
  uchar *puVar5;
  char *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  size_type sVar6;
  int in_ECX;
  short in_DX;
  uint in_ESI;
  Size *in_RDI;
  int in_R8D;
  char *in_R9;
  byte in_stack_00000010;
  int byteSize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> compressed;
  vector<unsigned_char,_std::allocator<unsigned_char>_> chunk;
  Size alignedSize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> decompressed;
  Image *in_stack_fffffffffffffe58;
  FILE *pFVar7;
  Size in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  allocator_type *in_stack_fffffffffffffe70;
  size_type in_stack_fffffffffffffe78;
  Image *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe80;
  undefined1 isSwitch_00;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  Image *image;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  uint uVar8;
  Image *in_stack_fffffffffffffef8;
  Size in_stack_ffffffffffffff00;
  string local_d0 [40];
  Image local_a8;
  Size local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  int local_50;
  int iStack_4c;
  Size local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  byte local_21;
  char *local_20;
  int local_18;
  int local_14;
  short local_e;
  uint local_c;
  Size *local_8;
  
  local_21 = in_stack_00000010 & 1;
  local_20 = in_R9;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_e = in_DX;
  local_c = in_ESI;
  local_8 = in_RDI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10950a);
  local_50 = local_14;
  iStack_4c = local_18;
  SVar3.height = local_18;
  SVar3.width = local_14;
  SVar3 = align(SVar3);
  local_48 = SVar3;
  if (local_c == 0) {
    if (local_e != 3) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar4,"Expected a size-0 type to be 3 (indexed, no alpha) but it wasn\'t...");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar2 = Size::area(&local_48);
    local_c = iVar2 + 0x400;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x10962b);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x109654);
    puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x109673);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_78);
    std::istream::read(local_20,(long)puVar5);
    local_88 = local_48;
    getIndexed(in_stack_fffffffffffffef8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_ffffffffffffff00,SVar3.height._3_1_,SVar3.width);
    local_a8.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe70);
  }
  else {
    __lhs = (char *)(ulong)local_c;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x10975d);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x109783);
    image = &local_a8;
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1097a2);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image);
    std::istream::read(local_20,(long)__rhs);
    this_00 = &local_a8;
    this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1097d7);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
    uVar1 = decompressHigu((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                           (uint8_t *)this,(int)((ulong)this_00 >> 0x20),
                           SUB81((ulong)this_00 >> 0x18,0));
    if (!(bool)uVar1) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(__lhs,__rhs);
      std::operator+(in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60);
      std::runtime_error::runtime_error(prVar4,local_d0);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe70);
    if ((local_e == 3) || (local_e == 2)) {
      getIndexed(in_stack_fffffffffffffef8,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),local_48,
                 SVar3.height._3_1_,SVar3.width);
    }
    else {
      Image::fastResize(in_stack_fffffffffffffe58,in_stack_fffffffffffffe60);
      iVar2 = Size::area(local_8);
      uVar8 = iVar2 << 2;
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_40);
      if (sVar6 < (ulong)(long)(int)uVar8) {
        pFVar7 = _stderr;
        sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_40);
        fprintf(pFVar7,"Decompressed too little data for chunk, have %zd but need %d bytes!\n",sVar6
                ,(ulong)uVar8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this,(size_type)this_00);
        isSwitch_00 = (undefined1)((ulong)this >> 0x38);
      }
      else {
        sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_40);
        isSwitch_00 = (undefined1)((ulong)this >> 0x38);
        if ((ulong)(long)(int)uVar8 < sVar6) {
          pFVar7 = _stderr;
          sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_40);
          fprintf(pFVar7,"Decompressed too much data for chunk, have %zd but only need %d bytes!\n",
                  sVar6,(ulong)uVar8);
        }
      }
      getRGB(image,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT17(uVar1,in_stack_fffffffffffffe88),(bool)isSwitch_00);
    }
    local_a8.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe70);
  return;
}

Assistant:

static void processChunkShared(Image &output, uint32_t size, ChunkHeader::Type type, int width, int height, std::istream &file, const std::string &name, bool isSwitch) {
	std::vector<uint8_t> decompressed;
	Size alignedSize = align({width, height});

	// If size is zero, then we're uncompressed and paletted
	if (size == 0) {
		if (type != ChunkHeader::TYPE_INDEXED) {
			throw std::runtime_error("Expected a size-0 type to be 3 (indexed, no alpha) but it wasn't...");
		}
		size = 1024 + alignedSize.area();
		std::vector<uint8_t> chunk(size);
		file.read((char *)chunk.data(), chunk.size());
		getIndexed(output, chunk, alignedSize, isSwitch);
		return;
	}
	else {
		std::vector<uint8_t> compressed(size);
		file.read((char *)compressed.data(), compressed.size());
		if (!decompressHigu(decompressed, compressed.data(), (int)compressed.size(), isSwitch)) {
			throw std::runtime_error("Decompression of " + name + " failed");
		}
	}

	if (type == ChunkHeader::TYPE_INDEXED || type == ChunkHeader::TYPE_INDEXED_ALPHA) {
		getIndexed(output, decompressed, alignedSize, isSwitch);
	}
	else {
		output.fastResize(alignedSize);
		int byteSize = output.size.area() * sizeof(Color);
		if (decompressed.size() < byteSize) {
			fprintf(stderr, "Decompressed too little data for chunk, have %zd but need %d bytes!\n", decompressed.size(), byteSize);
			decompressed.resize(byteSize);
		}
		else if (decompressed.size() > byteSize) {
			fprintf(stderr, "Decompressed too much data for chunk, have %zd but only need %d bytes!\n", decompressed.size(), byteSize);
		}
		getRGB(output, decompressed, isSwitch);
	}
}